

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

uint32_t spvtools::opt::anon_unknown_0::GetArrayLength
                   (DefUseManager *def_use_mgr,Instruction *array_type)

{
  uint __line;
  uint32_t uVar1;
  Instruction *this;
  char *__assertion;
  
  if (array_type->opcode_ == OpTypeArray) {
    uVar1 = Instruction::GetSingleWordInOperand(array_type,1);
    this = analysis::DefUseManager::GetDef(def_use_mgr,uVar1);
    if (this->opcode_ == OpConstant) {
      uVar1 = Instruction::GetSingleWordInOperand(this,0);
      return uVar1;
    }
    __assertion = "array_length_inst->opcode() == spv::Op::OpConstant";
    __line = 0x2f;
  }
  else {
    __assertion = "array_type->opcode() == spv::Op::OpTypeArray";
    __line = 0x2b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                ,__line,
                "uint32_t spvtools::opt::(anonymous namespace)::GetArrayLength(analysis::DefUseManager *, Instruction *)"
               );
}

Assistant:

uint32_t GetArrayLength(analysis::DefUseManager* def_use_mgr,
                        Instruction* array_type) {
  assert(array_type->opcode() == spv::Op::OpTypeArray);
  uint32_t const_int_id =
      array_type->GetSingleWordInOperand(kOpTypeArrayLengthInOperandIndex);
  Instruction* array_length_inst = def_use_mgr->GetDef(const_int_id);
  assert(array_length_inst->opcode() == spv::Op::OpConstant);
  return array_length_inst->GetSingleWordInOperand(
      kOpConstantValueInOperandIndex);
}